

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void benchmark::RunSpecifiedBenchmarks(BenchmarkReporter *reporter)

{
  bool bVar1;
  undefined8 uVar2;
  pointer pcVar3;
  pointer ptVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  Instance *benchmark_1;
  ostream *poVar8;
  pointer pIVar9;
  __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
  *this;
  undefined *puVar10;
  thread *thread_1;
  ulong uVar11;
  __native_type *iters;
  pointer ptVar12;
  __native_type *p_Var13;
  thread *thread;
  ulong uVar14;
  Instance *benchmark;
  bool bVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined4 uVar18;
  double dVar19;
  vector<std::thread,_std::allocator<std::thread>_> pool;
  double multiplier;
  string label;
  ThreadStats total;
  string spec;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  benchmarks_1;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  reports;
  string mem;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  benchmarks;
  int local_264;
  BenchmarkReporter *local_260;
  vector<std::thread,_std::allocator<std::thread>_> local_258;
  undefined1 local_238 [16];
  undefined1 local_228 [32];
  string local_208 [8];
  undefined8 local_200;
  __pthread_internal_list local_1f8;
  long local_1e8;
  double local_1e0;
  undefined8 uStack_1d8;
  ulong local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  thread local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  BenchmarkReporter *local_180;
  ThreadStats local_178;
  string local_168;
  vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
  local_148;
  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
  local_128;
  Instance *local_108;
  undefined1 local_100 [40];
  CheckHandler local_d8;
  CheckHandler local_d0;
  ulong local_c8;
  undefined8 uStack_c0;
  __native_type local_b8;
  condition_variable local_90 [48];
  undefined1 local_60;
  int local_50;
  double local_48;
  undefined1 local_40;
  ulong local_38;
  
  if (FLAGS_benchmark_list_tests) {
    local_b8.__align = 0;
    local_b8._8_8_ = (undefined8 *)0x0;
    local_b8._16_8_ = 0;
    internal::BenchmarkFamilies::GetInstance();
    local_228._16_2_ = 0x2e;
    local_228._8_8_ = 1;
    local_228._0_8_ = local_228 + 0x10;
    bVar6 = internal::BenchmarkFamilies::FindBenchmarks
                      (&internal::BenchmarkFamilies::GetInstance::instance,(string *)local_228,
                       (vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                        *)&local_b8.__data);
    if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
      operator_delete((void *)local_228._0_8_);
    }
    uVar5 = local_b8._8_8_;
    uVar2 = local_b8.__align;
    if (bVar6) {
      for (; uVar2 != uVar5; uVar2 = (undefined8 *)(uVar2 + 0x50)) {
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,*(char **)uVar2,*(undefined8 *)(uVar2 + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      }
    }
    std::
    vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ::~vector((vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
               *)&local_b8.__data);
    return;
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,FLAGS_benchmark_filter_abi_cxx11_._M_dataplus._M_p,
             FLAGS_benchmark_filter_abi_cxx11_._M_dataplus._M_p +
             FLAGS_benchmark_filter_abi_cxx11_._M_string_length);
  if (((char *)local_168._M_string_length == (char *)0x0) ||
     (iVar7 = std::__cxx11::string::compare((char *)&local_168), iVar7 == 0)) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_168,0,(char *)local_168._M_string_length,0x11f84f);
  }
  if (reporter == (BenchmarkReporter *)0x0) {
    iVar7 = std::__cxx11::string::compare((char *)&FLAGS_benchmark_format_abi_cxx11_);
    if (iVar7 == 0) {
      reporter = (BenchmarkReporter *)operator_new(0x10);
      puVar10 = &ConsoleReporter::vtable;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&FLAGS_benchmark_format_abi_cxx11_);
      if (iVar7 == 0) {
        reporter = (BenchmarkReporter *)operator_new(0x10);
        reporter->_vptr_BenchmarkReporter = (_func_int **)&PTR_ReportContext_0012a950;
        *(undefined1 *)&reporter[1]._vptr_BenchmarkReporter = 1;
        local_260 = reporter;
        goto LAB_00108e3e;
      }
      iVar7 = std::__cxx11::string::compare((char *)&FLAGS_benchmark_format_abi_cxx11_);
      if (iVar7 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unexpected format: \'",0x14);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,FLAGS_benchmark_format_abi_cxx11_._M_dataplus._M_p
                            ,FLAGS_benchmark_format_abi_cxx11_._M_string_length);
        std::operator<<(poVar8,"\'\n");
        exit(1);
      }
      reporter = (BenchmarkReporter *)operator_new(8);
      puVar10 = &CSVReporter::vtable;
    }
    reporter->_vptr_BenchmarkReporter = (_func_int **)(puVar10 + 0x10);
    local_260 = reporter;
  }
  else {
    local_260 = (BenchmarkReporter *)0x0;
  }
LAB_00108e3e:
  internal::GetNullLogInstance();
  if ((char *)local_168._M_string_length != (char *)0x0) {
    local_148.
    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ._M_impl.super__Vector_impl_data._M_start = (Instance *)0x0;
    local_148.
    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ._M_impl.super__Vector_impl_data._M_finish = (Instance *)0x0;
    local_148.
    super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    internal::BenchmarkFamilies::GetInstance();
    bVar6 = internal::BenchmarkFamilies::FindBenchmarks
                      (&internal::BenchmarkFamilies::GetInstance::instance,&local_168,&local_148);
    if (bVar6) {
      if (local_148.
          super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_148.
          super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar14 = 10;
      }
      else {
        pIVar9 = local_148.
                 super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar11 = 10;
        do {
          uVar14 = (pIVar9->name)._M_string_length;
          if (uVar14 < uVar11) {
            uVar14 = uVar11;
          }
          pIVar9 = pIVar9 + 1;
          uVar11 = uVar14;
        } while (pIVar9 != local_148.
                           super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      uVar11 = uVar14 + 7;
      if (FLAGS_benchmark_repetitions < 2) {
        uVar11 = uVar14;
      }
      local_50 = NumCPUs();
      local_48 = CyclesPerSecond();
      local_48 = local_48 / 1000000.0;
      local_40 = CpuScalingEnabled();
      local_38 = uVar11;
      iVar7 = (**reporter->_vptr_BenchmarkReporter)(reporter);
      local_180 = reporter;
      if (((char)iVar7 != '\0') &&
         (local_108 = local_148.
                      super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
         local_148.
         super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_148.
         super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        pIVar9 = local_148.
                 super__Vector_base<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_128.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_128.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_128.
          super__Vector_base<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_258.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_258.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_258.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if (pIVar9->multithreaded == true) {
            std::vector<std::thread,_std::allocator<std::thread>_>::resize
                      (&local_258,(long)pIVar9->threads);
          }
          if (0 < FLAGS_benchmark_repetitions) {
            iters = (__native_type *)0x1;
            local_264 = 0;
            do {
              local_100._8_8_ = &(((__native_type *)local_100)->__data).__list;
              local_100._16_8_ = 0;
              local_100[0x18] = '\0';
              do {
                iVar7 = internal::GetLogLevel();
                if (iVar7 < 2) {
                  poVar8 = internal::GetNullLogInstance();
                }
                else {
                  poVar8 = internal::GetErrorLogInstance();
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-- LOG(",7);
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"): ",3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Running ",8);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar8,(pIVar9->name)._M_dataplus._M_p,
                                    (pIVar9->name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8," for ",5);
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                p_Var13 = (__native_type *)0x11f58d;
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                if (GetBenchmarkLock()::lock == '\0') {
                  RunSpecifiedBenchmarks();
                }
                local_228._0_8_ = GetBenchmarkLock()::lock;
                local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
                std::unique_lock<std::mutex>::lock
                          ((unique_lock<std::mutex> *)&((__native_type *)local_228)->__data);
                local_228[8] = 1;
                (anonymous_namespace)::GetReportLabel_abi_cxx11_();
                (anonymous_namespace)::GetReportLabel[abi:cxx11]()::label_abi_cxx11_.
                _M_string_length = 0;
                *(anonymous_namespace)::GetReportLabel[abi:cxx11]()::label_abi_cxx11_._M_dataplus.
                 _M_p = '\0';
                std::unique_lock<std::mutex>::~unique_lock
                          ((unique_lock<std::mutex> *)&((__native_type *)local_228)->__data);
                local_b8.__data.__list.__next = (__pthread_internal_list *)0x0;
                local_b8._16_8_ = 0;
                local_b8.__data.__list.__prev = (__pthread_internal_list *)0x0;
                local_b8.__align = 0;
                local_b8._8_8_ = 0;
                std::condition_variable::condition_variable(local_90);
                local_60 = 0;
                this = (__uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                        *)operator_new(0xa0);
                iVar7 = pIVar9->threads;
                this[2]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[3]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                (this->_M_t).
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[1]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[4]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                std::condition_variable::condition_variable((condition_variable *)(this + 5));
                *(int *)&this[0xb]._M_t.
                         super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                         .
                         super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>
                         ._M_head_impl = iVar7;
                this[0xc]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)&local_b8;
                *(undefined1 *)
                 &this[0xd]._M_t.
                  super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                  .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                  _M_head_impl = 0;
                this[0x10]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                this[0x11]._M_t.
                super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                .super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>.
                _M_head_impl = (TimerManager *)0x0;
                *(undefined8 *)
                 ((long)&this[0x11]._M_t.
                         super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                         .
                         super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>
                         ._M_head_impl + 4) = 0;
                *(undefined8 *)
                 ((long)&this[0x12]._M_t.
                         super__Tuple_impl<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                         .
                         super__Head_base<0UL,_benchmark::(anonymous_namespace)::TimerManager_*,_false>
                         ._M_head_impl + 4) = 0;
                std::
                __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                ::reset(this,(pointer)&p_Var13->__data);
                ptVar4 = local_258.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                local_178.bytes_processed = 0;
                local_178.items_processed = 0;
                (anonymous_namespace)::running_benchmark = 1;
                ptVar12 = local_258.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                if (pIVar9->multithreaded == true) {
                  for (; ptVar12 != ptVar4; ptVar12 = ptVar12 + 1) {
                    if ((ptVar12->_M_id)._M_thread != 0) {
                      std::thread::join();
                    }
                  }
                  if (local_258.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish !=
                      local_258.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
                    uVar14 = 0;
                    do {
                      local_1b8._M_id._M_thread = (id)0;
                      local_228._0_8_ = operator_new(0x30);
                      *(undefined ***)local_228._0_8_ = &PTR___State_0012a868;
                      *(ThreadStats **)(local_228._0_8_ + 8) = &local_178;
                      *(ulong *)(local_228._0_8_ + 0x10) = uVar14;
                      *(__native_type **)(local_228._0_8_ + 0x18) = iters;
                      *(pointer *)(local_228._0_8_ + 0x20) = pIVar9;
                      *(code **)(local_228._0_8_ + 0x28) = anon_unknown_1::RunInThread;
                      p_Var13 = (__native_type *)local_228;
                      std::thread::_M_start_thread(&local_1b8,(__native_type *)local_228,0);
                      if ((long *)local_228._0_8_ != (long *)0x0) {
                        (**(code **)(*(long *)local_228._0_8_ + 8))();
                      }
                      if (local_258.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar14]._M_id._M_thread != 0) {
                        std::terminate();
                      }
                      local_258.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar14]._M_id._M_thread =
                           (native_handle_type)local_1b8._M_id._M_thread;
                      uVar14 = uVar14 + 1;
                    } while (uVar14 < (ulong)((long)local_258.
                                                                                                        
                                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_258.
                                                                                                        
                                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 3));
                  }
                }
                else {
                  p_Var13 = iters;
                  anon_unknown_1::RunInThread(pIVar9,(size_t)iters,0,&local_178);
                }
                Notification::WaitForNotification((Notification *)&local_b8.__data);
                pcVar3 = (anonymous_namespace)::timer_manager;
                (anonymous_namespace)::running_benchmark = 0;
                local_228._0_8_ = (anonymous_namespace)::timer_manager;
                local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
                std::unique_lock<std::mutex>::lock
                          ((unique_lock<std::mutex> *)&((__native_type *)local_228)->__data);
                local_228[8] = '\x01';
                if (pcVar3[0x68] != '\0') {
                  internal::CheckHandler::CheckHandler
                            (&local_d8,"!running_",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
                             ,"cpu_time_used",0xc1);
                  internal::CheckHandler::~CheckHandler(&local_d8);
                }
                internal::GetNullLogInstance();
                local_238._0_8_ = *(undefined8 *)(pcVar3 + 0x88);
                std::unique_lock<std::mutex>::~unique_lock
                          ((unique_lock<std::mutex> *)&((__native_type *)local_228)->__data);
                pcVar3 = (anonymous_namespace)::timer_manager;
                local_228._0_8_ = (anonymous_namespace)::timer_manager;
                local_228[8] = '\0';
                std::unique_lock<std::mutex>::lock
                          ((unique_lock<std::mutex> *)&((__native_type *)local_228)->__data);
                local_228[8] = 1;
                if (pcVar3[0x68] != '\0') {
                  internal::CheckHandler::CheckHandler
                            (&local_d0,"!running_",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/benchmark.cc"
                             ,"real_time_used",0xba);
                  internal::CheckHandler::~CheckHandler(&local_d0);
                }
                internal::GetNullLogInstance();
                dVar19 = *(double *)(pcVar3 + 0x80);
                std::unique_lock<std::mutex>::~unique_lock
                          ((unique_lock<std::mutex> *)&((__native_type *)local_228)->__data);
                std::
                __uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                ::reset((__uniq_ptr_impl<benchmark::(anonymous_namespace)::TimerManager,_std::default_delete<benchmark::(anonymous_namespace)::TimerManager>_>
                         *)0x0,(pointer)&p_Var13->__data);
                iVar7 = internal::GetLogLevel();
                if (iVar7 < 2) {
                  poVar8 = internal::GetNullLogInstance();
                }
                else {
                  poVar8 = internal::GetErrorLogInstance();
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-- LOG(",7);
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"): ",3);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Ran in ",7);
                poVar8 = std::ostream::_M_insert<double>((double)local_238._0_8_);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
                poVar8 = std::ostream::_M_insert<double>(dVar19);
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                dVar17 = dVar19;
                if (pIVar9->use_real_time == false) {
                  dVar17 = (double)local_238._0_8_;
                }
                local_1b8._M_id._M_thread = (id)local_1a8;
                local_1b0 = 0;
                local_1a8[0] = 0;
                local_198._0_8_ = dVar17;
                if (GetBenchmarkLock()::lock == '\0') {
                  RunSpecifiedBenchmarks();
                }
                local_228._0_8_ = GetBenchmarkLock()::lock;
                local_228._8_8_ = local_228._8_8_ & 0xffffffffffffff00;
                std::unique_lock<std::mutex>::lock
                          ((unique_lock<std::mutex> *)&((__native_type *)local_228)->__data);
                local_228[8] = 1;
                (anonymous_namespace)::GetReportLabel_abi_cxx11_();
                std::__cxx11::string::_M_assign((string *)&local_1b8);
                std::unique_lock<std::mutex>::~unique_lock
                          ((unique_lock<std::mutex> *)&((__native_type *)local_228)->__data);
                uVar14 = -(ulong)(ABS(pIVar9->min_time) < 2.220446049250313e-16);
                dVar17 = (double)(~uVar14 & (ulong)pIVar9->min_time |
                                 (ulong)FLAGS_benchmark_min_time & uVar14);
                bVar15 = iters < (__native_type *)0x3b9aca00;
                bVar6 = (double)local_198._0_8_ < dVar17;
                bVar1 = dVar19 < dVar17 * 5.0;
                if (bVar1 && ((bVar15 && local_264 == 0) && bVar6)) {
                  dVar19 = 1e-09;
                  if (1e-09 <= (double)local_198._0_8_) {
                    dVar19 = (double)local_198._0_8_;
                  }
                  local_228._0_8_ = (dVar17 * 1.4) / dVar19;
                  p_Var13 = (__native_type *)local_228;
                  if ((double)local_198._0_8_ / dVar17 <= 0.1) {
                    local_100._0_8_ = 0x4024000000000000;
                    p_Var13 = (__native_type *)local_100;
                    if ((double)local_228._0_8_ < 10.0) {
                      p_Var13 = (__native_type *)local_228;
                    }
                  }
                  local_228._0_8_ = (((string *)&(p_Var13->__data).__lock)->_M_dataplus)._M_p;
                  if ((double)local_228._0_8_ <= 1.0) {
                    local_228._0_8_ = (pointer)0x4000000000000000;
                  }
                  uVar2 = local_228._0_8_;
                  auVar16._8_4_ = (int)((ulong)iters >> 0x20);
                  auVar16._0_8_ = iters;
                  auVar16._12_4_ = 0x45300000;
                  dVar17 = auVar16._8_8_ - 1.9342813113834067e+25;
                  uVar18 = (undefined4)((ulong)dVar17 >> 0x20);
                  dVar19 = dVar17 + ((double)CONCAT44(0x43300000,(int)iters) - 4503599627370496.0);
                  local_238._8_4_ = SUB84(dVar17,0);
                  local_238._0_8_ = dVar19;
                  local_238._12_4_ = uVar18;
                  local_198._8_4_ = SUB84(dVar17,0);
                  local_198._0_8_ = dVar19 + 1.0;
                  local_198._12_4_ = uVar18;
                  iVar7 = internal::GetLogLevel();
                  if (iVar7 < 3) {
                    poVar8 = internal::GetNullLogInstance();
                  }
                  else {
                    poVar8 = internal::GetErrorLogInstance();
                  }
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"-- LOG(",7);
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"): ",3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Next iters: ",0xc);
                  dVar17 = (double)local_238._0_8_ * (double)uVar2;
                  dVar19 = (double)local_198._0_8_;
                  if ((double)local_198._0_8_ <= dVar17) {
                    dVar19 = dVar17;
                  }
                  dVar17 = 1000000000.0;
                  if (dVar19 <= 1000000000.0) {
                    dVar17 = dVar19;
                  }
                  local_238._0_8_ = dVar17;
                  poVar8 = std::ostream::_M_insert<double>(dVar17);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
                  poVar8 = std::ostream::_M_insert<double>((double)uVar2);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
                  iters = (__native_type *)(long)(int)((double)local_238._0_8_ + 0.5);
                }
                else {
                  dVar17 = 0.0;
                  if (local_178.bytes_processed < 1) {
                    local_c8 = 0;
                  }
                  else {
                    local_c8 = -(ulong)(0.0 < (double)local_198._0_8_) &
                               (ulong)((double)local_178.bytes_processed / (double)local_198._0_8_);
                  }
                  uStack_c0 = 0;
                  if (0.0 < (double)local_198._0_8_) {
                    dVar17 = (double)local_178.items_processed / (double)local_198._0_8_;
                  }
                  if (local_178.items_processed < 1) {
                    dVar17 = 0.0;
                  }
                  local_198._0_8_ = dVar17;
                  local_228._0_8_ = local_228 + 0x10;
                  local_228._8_8_ = 0;
                  local_228._16_2_ = local_228._16_2_ & 0xff00;
                  local_208 = (string  [8])&local_1f8;
                  local_200 = 0;
                  local_1f8.__prev._0_1_ = 0;
                  local_1e8 = 1;
                  local_1c0 = 0;
                  local_1d0 = 0;
                  uStack_1c8 = 0;
                  local_1e0 = 0.0;
                  uStack_1d8 = 0;
                  std::__cxx11::string::_M_assign((string *)&((__native_type *)local_228)->__data);
                  std::__cxx11::string::_M_assign(local_208);
                  local_1e8 = (long)pIVar9->threads * (long)iters;
                  uStack_1d8 = local_238._0_8_;
                  local_1d0 = local_c8;
                  uStack_1c8 = local_198._0_8_;
                  local_1e0 = dVar19;
                  std::
                  vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
                  ::push_back(&local_128,(value_type *)&((__native_type *)local_228)->__data);
                  if (local_208 != (string  [8])&local_1f8) {
                    operator_delete((void *)local_208);
                  }
                  if ((undefined1 *)local_228._0_8_ != local_228 + 0x10) {
                    operator_delete((void *)local_228._0_8_);
                  }
                }
                if (local_1b8._M_id._M_thread != (id)local_1a8) {
                  operator_delete((void *)local_1b8._M_id._M_thread);
                }
                std::condition_variable::~condition_variable(local_90);
              } while (bVar1 && ((bVar15 && local_264 == 0) && bVar6));
              if ((__pthread_list_t *)local_100._8_8_ !=
                  &(((__native_type *)local_100)->__data).__list) {
                operator_delete((void *)local_100._8_8_);
              }
              local_264 = local_264 + 1;
            } while (local_264 < FLAGS_benchmark_repetitions);
          }
          (*local_180->_vptr_BenchmarkReporter[1])(local_180,&local_128);
          ptVar4 = local_258.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          ptVar12 = local_258.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (pIVar9->multithreaded == true) {
            for (; ptVar12 != ptVar4; ptVar12 = ptVar12 + 1) {
              std::thread::join();
            }
          }
          std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_258);
          std::
          vector<benchmark::BenchmarkReporter::Run,_std::allocator<benchmark::BenchmarkReporter::Run>_>
          ::~vector(&local_128);
          pIVar9 = pIVar9 + 1;
          reporter = local_180;
        } while (pIVar9 != local_108);
      }
    }
    std::
    vector<benchmark::internal::Benchmark::Instance,_std::allocator<benchmark::internal::Benchmark::Instance>_>
    ::~vector(&local_148);
  }
  (*reporter->_vptr_BenchmarkReporter[2])(reporter);
  if (local_260 != (BenchmarkReporter *)0x0) {
    (*local_260->_vptr_BenchmarkReporter[4])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RunSpecifiedBenchmarks(BenchmarkReporter* reporter) {
  if (FLAGS_benchmark_list_tests) {
    internal::PrintBenchmarkList();
    return;
  }
  std::string spec = FLAGS_benchmark_filter;
  if (spec.empty() || spec == "all")
    spec = ".";  // Regexp that matches all benchmarks

  std::unique_ptr<BenchmarkReporter> default_reporter;
  if (!reporter) {
    default_reporter = internal::GetDefaultReporter();
    reporter = default_reporter.get();
  }
  internal::RunMatchingBenchmarks(spec, reporter);
  reporter->Finalize();
}